

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O2

UBool u_hasBinaryProperty_63(UChar32 c,UProperty which)

{
  UBool UVar1;
  uint16_t uVar2;
  char16_t cVar3;
  uint32_t uVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  Normalizer2 *pNVar8;
  Normalizer2Impl *pNVar9;
  undefined8 src;
  undefined4 uVar10;
  bool bVar11;
  UErrorCode UStack_dc;
  UnicodeString UStack_d8;
  ReorderingBuffer RStack_98;
  UnicodeString UStack_58;
  
  if (0x40 < (uint)which) {
    return '\0';
  }
  switch(which) {
  default:
    uVar4 = u_getUnicodeProperties_63(c,*(int32_t *)(&binProps + (ulong)(uint)which * 2));
    return (*(uint *)((long)&binProps + (ulong)(uint)which * 0x10 + 4) & uVar4) != 0;
  case UCHAR_BIDI_CONTROL:
    UVar1 = ubidi_isBidiControl_63(c);
    return UVar1;
  case UCHAR_BIDI_MIRRORED:
    UVar1 = ubidi_isMirrored_63(c);
    return UVar1;
  case UCHAR_FULL_COMPOSITION_EXCLUSION:
    UStack_58.fUnion._48_8_ = UStack_58.fUnion._48_8_ & 0xffffffff;
    UStack_58.fUnion._32_8_ = 0x2b8cc8;
    pNVar9 = icu_63::Normalizer2Factory::getNFCImpl
                       ((UErrorCode *)(UStack_58.fUnion.fStackFields.fBuffer + 0x19));
    if ((int)UStack_58.fUnion._52_4_ < 1) {
      UStack_58.fUnion._32_8_ = 0x2b8cdf;
      uVar2 = icu_63::Normalizer2Impl::getNorm16(pNVar9,c);
      bVar11 = uVar2 < pNVar9->minMaybeYes && pNVar9->minNoNo <= uVar2;
    }
    else {
      bVar11 = false;
    }
    return bVar11;
  case UCHAR_JOIN_CONTROL:
    UVar1 = ubidi_isJoinControl_63(c);
    return UVar1;
  case UCHAR_LOWERCASE:
  case UCHAR_SOFT_DOTTED:
  case UCHAR_UPPERCASE:
  case UCHAR_CASE_SENSITIVE:
  case UCHAR_CASED:
  case UCHAR_CASE_IGNORABLE:
  case UCHAR_CHANGES_WHEN_LOWERCASED:
  case UCHAR_CHANGES_WHEN_UPPERCASED:
  case UCHAR_CHANGES_WHEN_TITLECASED:
  case UCHAR_CHANGES_WHEN_CASEMAPPED:
    iVar5 = ucase_hasBinaryProperty_63(c,which);
    return (UBool)iVar5;
  case UCHAR_NFD_INERT:
  case UCHAR_NFKD_INERT:
  case UCHAR_NFC_INERT:
  case UCHAR_NFKC_INERT:
    UStack_58.fUnion._48_8_ = 0x2b8d28;
    pNVar8 = icu_63::Normalizer2Factory::getInstance
                       (which - 0x23,(UErrorCode *)&stack0xffffffffffffffec);
    UStack_58.fUnion._48_8_ = 0x2b8d40;
    iVar7 = (*(pNVar8->super_UObject)._vptr_UObject[0x11])(pNVar8,c);
    return (char)iVar7 != '\0';
  case UCHAR_SEGMENT_STARTER:
    UStack_58.fUnion._48_8_ = UStack_58.fUnion._48_8_ & 0xffffffff;
    UStack_58.fUnion._32_8_ = 0x2b8d69;
    pNVar9 = icu_63::Normalizer2Factory::getNFCImpl
                       ((UErrorCode *)(UStack_58.fUnion.fStackFields.fBuffer + 0x19));
    if ((int)UStack_58.fUnion._52_4_ < 1) {
      UStack_58.fUnion._32_8_ = 0x2b8d83;
      UVar1 = icu_63::Normalizer2Impl::ensureCanonIterData
                        (pNVar9,(UErrorCode *)(UStack_58.fUnion.fStackFields.fBuffer + 0x19));
      if (UVar1 != '\0') {
        UStack_58.fUnion._32_8_ = 0x2b8d91;
        UVar1 = icu_63::Normalizer2Impl::isCanonSegmentStarter(pNVar9,c);
        return UVar1 != '\0';
      }
    }
    return '\0';
  case UCHAR_POSIX_ALNUM:
    UVar1 = u_isalnumPOSIX_63(c);
    return UVar1;
  case UCHAR_POSIX_BLANK:
    UVar1 = u_isblank_63(c);
    return UVar1;
  case UCHAR_POSIX_GRAPH:
    UVar1 = u_isgraphPOSIX_63(c);
    return UVar1;
  case UCHAR_POSIX_PRINT:
    UVar1 = u_isprintPOSIX_63(c);
    return UVar1;
  case UCHAR_POSIX_XDIGIT:
    UVar1 = u_isxdigit_63(c);
    return UVar1;
  case UCHAR_CHANGES_WHEN_CASEFOLDED:
    break;
  case UCHAR_CHANGES_WHEN_NFKC_CASEFOLDED:
    UStack_dc = U_ZERO_ERROR;
    pNVar9 = icu_63::Normalizer2Factory::getNFKC_CFImpl(&UStack_dc);
    if (UStack_dc < U_ILLEGAL_ARGUMENT_ERROR) {
      icu_63::UnicodeString::UnicodeString(&UStack_d8,c);
      RStack_98.str = &UStack_58;
      UStack_58.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_003b1268;
      UStack_58.fUnion.fStackFields.fLengthAndFlags = 2;
      RStack_98.start = (UChar *)0x0;
      RStack_98.reorderStart._0_5_ = 0;
      RStack_98.reorderStart._5_3_ = 0;
      RStack_98.limit._0_5_ = 0;
      RStack_98._37_8_ = 0;
      RStack_98.impl = pNVar9;
      iVar7 = icu_63::ReorderingBuffer::init(&RStack_98,(EVP_PKEY_CTX *)0x5);
      if ((char)iVar7 != '\0') {
        if ((UStack_d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
          if ((UStack_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            UStack_d8.fUnion.fFields.fArray = UStack_d8.fUnion.fStackFields.fBuffer;
          }
        }
        else {
          UStack_d8.fUnion.fFields.fArray = (char16_t *)0x0;
        }
        if (-1 < UStack_d8.fUnion.fStackFields.fLengthAndFlags) {
          UStack_d8.fUnion.fFields.fLength = (int)UStack_d8.fUnion.fStackFields.fLengthAndFlags >> 5
          ;
        }
        icu_63::Normalizer2Impl::compose
                  (pNVar9,UStack_d8.fUnion.fFields.fArray,
                   (char16_t *)
                   ((long)UStack_d8.fUnion.fFields.fArray +
                   (long)UStack_d8.fUnion.fFields.fLength * 2),'\0','\x01',&RStack_98,&UStack_dc);
      }
      icu_63::ReorderingBuffer::~ReorderingBuffer(&RStack_98);
      if (UStack_dc < U_ILLEGAL_ARGUMENT_ERROR) {
        UVar1 = icu_63::UnicodeString::operator!=(&UStack_58,&UStack_d8);
        bVar11 = UVar1 != '\0';
      }
      else {
        bVar11 = false;
      }
      icu_63::UnicodeString::~UnicodeString(&UStack_58);
      icu_63::UnicodeString::~UnicodeString(&UStack_d8);
    }
    else {
      bVar11 = false;
    }
    return bVar11;
  case UCHAR_REGIONAL_INDICATOR:
    return c - 0x1f1e6U < 0x1a;
  }
  UStack_d8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b1268;
  UStack_d8.fUnion.fStackFields.fLengthAndFlags = 2;
  UStack_dc = U_ZERO_ERROR;
  pNVar8 = icu_63::Normalizer2::getNFCInstance(&UStack_dc);
  if (UStack_dc < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar7 = (*(pNVar8->super_UObject)._vptr_UObject[7])(pNVar8,c,&UStack_d8);
    if ((char)iVar7 == '\0') {
      if (-1 < c) goto LAB_002b8e40;
    }
    else {
      uVar6 = (uint)UStack_d8.fUnion.fStackFields.fLengthAndFlags;
      uVar10 = UStack_d8.fUnion.fFields.fLength;
      if (-1 < UStack_d8.fUnion.fStackFields.fLengthAndFlags) {
        uVar10 = (int)uVar6 >> 5;
      }
      if (uVar10 == 1) {
        cVar3 = icu_63::UnicodeString::doCharAt(&UStack_d8,0);
        c = (UChar32)(ushort)cVar3;
LAB_002b8e40:
        iVar5 = ucase_toFullFolding_63(c,(UChar **)&RStack_98,0);
        bVar11 = -1 < iVar5;
        goto LAB_002b8e53;
      }
      if ((int)uVar10 < 3) {
        c = icu_63::UnicodeString::char32At(&UStack_d8,0);
        if ((-1 < c) && (uVar10 == 2 - (uint)((uint)c < 0x10000))) goto LAB_002b8e40;
        uVar6 = (uint)(ushort)UStack_d8.fUnion.fStackFields.fLengthAndFlags;
      }
      if ((uVar6 & 0x11) == 0) {
        src = UStack_d8.fUnion.fFields.fArray;
        if ((uVar6 & 2) != 0) {
          src = UStack_d8.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        src = (char16_t *)0x0;
      }
      uVar10 = UStack_d8.fUnion.fFields.fLength;
      if (-1 < (short)uVar6) {
        uVar10 = (int)(short)uVar6 >> 5;
      }
      iVar5 = u_strFoldCase_63((UChar *)&RStack_98,0x3e,(UChar *)src,uVar10,0,&UStack_dc);
      if (UStack_dc < U_ILLEGAL_ARGUMENT_ERROR) {
        if ((UStack_d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
          if ((UStack_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            UStack_d8.fUnion.fFields.fArray = UStack_d8.fUnion.fStackFields.fBuffer;
          }
        }
        else {
          UStack_d8.fUnion.fFields.fArray = (char16_t *)0x0;
        }
        if (-1 < UStack_d8.fUnion.fStackFields.fLengthAndFlags) {
          UStack_d8.fUnion.fFields.fLength = (int)UStack_d8.fUnion.fStackFields.fLengthAndFlags >> 5
          ;
        }
        iVar5 = u_strCompare_63(UStack_d8.fUnion.fFields.fArray,UStack_d8.fUnion.fFields.fLength,
                                (UChar *)&RStack_98,iVar5,'\0');
        bVar11 = iVar5 != 0;
        goto LAB_002b8e53;
      }
    }
  }
  bVar11 = false;
LAB_002b8e53:
  icu_63::UnicodeString::~UnicodeString(&UStack_d8);
  return bVar11;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_hasBinaryProperty(UChar32 c, UProperty which) {
    /* c is range-checked in the functions that are called from here */
    if(which<UCHAR_BINARY_START || UCHAR_BINARY_LIMIT<=which) {
        /* not a known binary property */
        return FALSE;
    } else {
        const BinaryProperty &prop=binProps[which];
        return prop.contains(prop, c, which);
    }
}